

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  int i;
  uint uVar5;
  ulong uVar6;
  
  sVar1 = ggml_hash_insert(&cgraph->visited_hash_set,node);
  if (sVar1 != 0xfffffffffffffffe) {
    uVar6 = 9;
    for (uVar5 = 0; uVar5 != 10; uVar5 = uVar5 + 1) {
      uVar2 = (ulong)uVar5;
      if (cgraph->order == GGML_CGRAPH_EVAL_ORDER_RIGHT_TO_LEFT) {
        uVar2 = uVar6;
      }
      if (cgraph->order == GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT) {
        uVar2 = (ulong)uVar5;
      }
      if (node->src[uVar2] != (ggml_tensor *)0x0) {
        ggml_visit_parents(cgraph,node->src[uVar2]);
      }
      uVar6 = (ulong)((int)uVar6 - 1);
    }
    if ((node->op == GGML_OP_NONE) && ((node->flags & 4) == 0)) {
      iVar4 = cgraph->n_leafs;
      if (cgraph->size <= iVar4) {
        pcVar3 = "cgraph->n_leafs < cgraph->size";
        iVar4 = 0x1690;
LAB_00128aca:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   iVar4,"GGML_ASSERT(%s) failed",pcVar3);
      }
      if (node->name[0] == '\0') {
        ggml_format_name(node,"leaf_%d");
        iVar4 = cgraph->n_leafs;
      }
      cgraph->leafs[iVar4] = node;
      cgraph->n_leafs = iVar4 + 1;
    }
    else {
      iVar4 = cgraph->n_nodes;
      if (cgraph->size <= iVar4) {
        pcVar3 = "cgraph->n_nodes < cgraph->size";
        iVar4 = 0x1699;
        goto LAB_00128aca;
      }
      if (node->name[0] == '\0') {
        ggml_format_name(node,"node_%d");
        iVar4 = cgraph->n_nodes;
      }
      cgraph->nodes[iVar4] = node;
      cgraph->n_nodes = iVar4 + 1;
    }
  }
  return;
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    // check if already visited
    if (ggml_hash_insert(&cgraph->visited_hash_set, node) == GGML_HASHSET_ALREADY_EXISTS) {
        return;
    }

    for (int i = 0; i < GGML_MAX_SRC; ++i) {
        const int k =
            (cgraph->order == GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT) ? i :
            (cgraph->order == GGML_CGRAPH_EVAL_ORDER_RIGHT_TO_LEFT) ? (GGML_MAX_SRC-1-i) :
            /* unknown order, just fall back to using i*/ i;
        if (node->src[k]) {
            ggml_visit_parents(cgraph, node->src[k]);
        }
    }

    if (node->op == GGML_OP_NONE && !(node->flags & GGML_TENSOR_FLAG_PARAM)) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < cgraph->size);

        if (strlen(node->name) == 0) {
            ggml_format_name(node, "leaf_%d", cgraph->n_leafs);
        }

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < cgraph->size);

        if (strlen(node->name) == 0) {
            ggml_format_name(node, "node_%d", cgraph->n_nodes);
        }

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->n_nodes++;
    }
}